

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall
van_kampen::Graph::mergeNodes
          (Graph *this,nodeId_t alive,nodeId_t dead,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *untouchable)

{
  bool bVar1;
  Node *pNVar2;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pdVar3;
  reference pTVar4;
  size_type sVar5;
  Transition *edge;
  iterator __end2;
  iterator __begin2;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *__range2;
  Transition *edgeFromDead;
  iterator __end1;
  iterator __begin1;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *__range1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *untouchable_local;
  nodeId_t dead_local;
  nodeId_t alive_local;
  Graph *this_local;
  
  untouchable_local._0_4_ = dead;
  untouchable_local._4_4_ = alive;
  _dead_local = this;
  pNVar2 = node(this,dead);
  pdVar3 = Node::transitions(pNVar2);
  std::deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::begin
            ((iterator *)&__end1._M_node,pdVar3);
  std::deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::end
            ((iterator *)&edgeFromDead,pdVar3);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&edgeFromDead), bVar1) {
    pTVar4 = std::
             _Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
             ::operator*((_Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
                          *)&__end1._M_node);
    sVar5 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::count
                      (untouchable,&pTVar4->to);
    if (sVar5 == 0) {
      pNVar2 = node(this,untouchable_local._4_4_);
      Node::addTransition(pNVar2,pTVar4->to,&pTVar4->label,false,false);
      pNVar2 = node(this,pTVar4->to);
      pdVar3 = Node::transitions(pNVar2);
      std::deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::begin
                ((iterator *)&__end2._M_node,pdVar3);
      std::deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::end
                ((iterator *)&edge,pdVar3);
      while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&edge), bVar1) {
        pTVar4 = std::
                 _Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
                 ::operator*((_Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
                              *)&__end2._M_node);
        if (pTVar4->to == (nodeId_t)untouchable_local) {
          pTVar4->to = untouchable_local._4_4_;
        }
        std::
        _Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
        ::operator++((_Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
                      *)&__end2._M_node);
      }
    }
    std::_Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
    ::operator++((_Deque_iterator<van_kampen::Transition,_van_kampen::Transition_&,_van_kampen::Transition_*>
                  *)&__end1._M_node);
  }
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
            (&this->removedNodes_,(value_type *)&untouchable_local);
  return;
}

Assistant:

void Graph::mergeNodes(nodeId_t alive, nodeId_t dead, const std::unordered_set<nodeId_t> &untouchable)
{
    for (Transition &edgeFromDead : node(dead).transitions())
    {
        if (untouchable.count(edgeFromDead.to))
        {
            continue;
        }
        node(alive).addTransition(edgeFromDead.to, edgeFromDead.label, false, false); // TODO
        for (Transition &edge : node(edgeFromDead.to).transitions())
        {
            if (edge.to == dead)
            {
                edge.to = alive;
            }
        }
    }
    removedNodes_.insert(dead);
}